

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON * cJSON_CreateFloatArray(float *numbers,int count)

{
  float fVar1;
  cJSON *item;
  cJSON *pcVar2;
  int iVar3;
  ulong uVar4;
  cJSON *pcVar5;
  
  if ((numbers == (float *)0x0 || count < 0) ||
     (item = (cJSON *)(*global_hooks.allocate)(0x40), item == (cJSON *)0x0)) {
LAB_00105272:
    item = (cJSON *)0x0;
  }
  else {
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    item->type = 0x20;
    if (count == 0) {
      pcVar2 = (cJSON *)0x0;
    }
    else {
      uVar4 = 0;
      pcVar5 = (cJSON *)0x0;
      do {
        fVar1 = numbers[uVar4];
        pcVar2 = (cJSON *)(*global_hooks.allocate)(0x40);
        if (pcVar2 == (cJSON *)0x0) {
          cJSON_Delete(item);
          goto LAB_00105272;
        }
        pcVar2->child = (cJSON *)0x0;
        *(undefined8 *)&pcVar2->type = 0;
        pcVar2->valuedouble = 0.0;
        pcVar2->string = (char *)0x0;
        pcVar2->valuestring = (char *)0x0;
        *(undefined8 *)&pcVar2->valueint = 0;
        pcVar2->next = (cJSON *)0x0;
        pcVar2->prev = (cJSON *)0x0;
        pcVar2->type = 8;
        pcVar2->valuedouble = (double)fVar1;
        iVar3 = 0x7fffffff;
        if (((double)fVar1 < 2147483647.0) && (iVar3 = -0x80000000, -2.1474836e+09 < fVar1)) {
          iVar3 = (int)fVar1;
        }
        pcVar2->valueint = iVar3;
        if (uVar4 == 0) {
          item->child = pcVar2;
        }
        else {
          pcVar5->next = pcVar2;
          pcVar2->prev = pcVar5;
        }
        uVar4 = uVar4 + 1;
        pcVar5 = pcVar2;
      } while (uVar4 < (uint)count);
    }
    if (item->child != (cJSON *)0x0) {
      item->child->prev = pcVar2;
    }
  }
  return item;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateFloatArray(const float *numbers, int count)
{
    size_t i = 0;
    cJSON *n = NULL;
    cJSON *p = NULL;
    cJSON *a = NULL;

    if ((count < 0) || (numbers == NULL))
    {
        return NULL;
    }

    a = cJSON_CreateArray();

    for(i = 0; a && (i < (size_t)count); i++)
    {
        n = cJSON_CreateNumber((double)numbers[i]);
        if(!n)
        {
            cJSON_Delete(a);
            return NULL;
        }
        if(!i)
        {
            a->child = n;
        }
        else
        {
            suffix_object(p, n);
        }
        p = n;
    }

    if (a && a->child) {
        a->child->prev = n;
    }

    return a;
}